

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

uint Aig_CutTruthPhase(Aig_Cut_t *pCut,Aig_Cut_t *pCut1)

{
  int local_24;
  int local_20;
  int k;
  int i;
  uint uPhase;
  Aig_Cut_t *pCut1_local;
  Aig_Cut_t *pCut_local;
  
  k = 0;
  local_24 = 0;
  local_20 = 0;
  while ((local_20 < pCut->nFanins && (local_24 != pCut1->nFanins))) {
    if (*(int *)((long)&pCut1[1].pNext + (long)local_24 * 4) <=
        *(int *)((long)&pCut[1].pNext + (long)local_20 * 4)) {
      if (*(int *)((long)&pCut[1].pNext + (long)local_20 * 4) !=
          *(int *)((long)&pCut1[1].pNext + (long)local_24 * 4)) {
        __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCuts.c"
                      ,0x102,"unsigned int Aig_CutTruthPhase(Aig_Cut_t *, Aig_Cut_t *)");
      }
      k = 1 << ((byte)local_20 & 0x1f) | k;
      local_24 = local_24 + 1;
    }
    local_20 = local_20 + 1;
  }
  return k;
}

Assistant:

static inline unsigned Aig_CutTruthPhase( Aig_Cut_t * pCut, Aig_Cut_t * pCut1 )
{
    unsigned uPhase = 0;
    int i, k;
    for ( i = k = 0; i < pCut->nFanins; i++ )
    {
        if ( k == pCut1->nFanins )
            break;
        if ( pCut->pFanins[i] < pCut1->pFanins[k] )
            continue;
        assert( pCut->pFanins[i] == pCut1->pFanins[k] );
        uPhase |= (1 << i);
        k++;
    }
    return uPhase;
}